

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decContext.cpp
# Opt level: O0

decContext * uprv_decContextSetStatusFromStringQuiet_63(decContext *context,char *string)

{
  int iVar1;
  char *string_local;
  decContext *context_local;
  
  iVar1 = strcmp(string,"Conversion syntax");
  if (iVar1 == 0) {
    context_local = uprv_decContextSetStatusQuiet_63(context,1);
  }
  else {
    iVar1 = strcmp(string,"Division by zero");
    if (iVar1 == 0) {
      context_local = uprv_decContextSetStatusQuiet_63(context,2);
    }
    else {
      iVar1 = strcmp(string,"Division impossible");
      if (iVar1 == 0) {
        context_local = uprv_decContextSetStatusQuiet_63(context,4);
      }
      else {
        iVar1 = strcmp(string,"Division undefined");
        if (iVar1 == 0) {
          context_local = uprv_decContextSetStatusQuiet_63(context,8);
        }
        else {
          iVar1 = strcmp(string,"Inexact");
          if (iVar1 == 0) {
            context_local = uprv_decContextSetStatusQuiet_63(context,0x20);
          }
          else {
            iVar1 = strcmp(string,"Insufficient storage");
            if (iVar1 == 0) {
              context_local = uprv_decContextSetStatusQuiet_63(context,0x10);
            }
            else {
              iVar1 = strcmp(string,"Invalid context");
              if (iVar1 == 0) {
                context_local = uprv_decContextSetStatusQuiet_63(context,0x40);
              }
              else {
                iVar1 = strcmp(string,"Invalid operation");
                if (iVar1 == 0) {
                  context_local = uprv_decContextSetStatusQuiet_63(context,0x80);
                }
                else {
                  iVar1 = strcmp(string,"Overflow");
                  if (iVar1 == 0) {
                    context_local = uprv_decContextSetStatusQuiet_63(context,0x200);
                  }
                  else {
                    iVar1 = strcmp(string,"Clamped");
                    if (iVar1 == 0) {
                      context_local = uprv_decContextSetStatusQuiet_63(context,0x400);
                    }
                    else {
                      iVar1 = strcmp(string,"Rounded");
                      if (iVar1 == 0) {
                        context_local = uprv_decContextSetStatusQuiet_63(context,0x800);
                      }
                      else {
                        iVar1 = strcmp(string,"Subnormal");
                        if (iVar1 == 0) {
                          context_local = uprv_decContextSetStatusQuiet_63(context,0x1000);
                        }
                        else {
                          iVar1 = strcmp(string,"Underflow");
                          if (iVar1 == 0) {
                            context_local = uprv_decContextSetStatusQuiet_63(context,0x2000);
                          }
                          else {
                            iVar1 = strcmp(string,"No status");
                            context_local = context;
                            if (iVar1 != 0) {
                              context_local = (decContext *)0x0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return context_local;
}

Assistant:

U_CAPI decContext *  U_EXPORT2 uprv_decContextSetStatusFromStringQuiet(decContext *context,
                                                const char *string) {
  if (strcmp(string, DEC_Condition_CS)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Conversion_syntax);
  if (strcmp(string, DEC_Condition_DZ)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Division_by_zero);
  if (strcmp(string, DEC_Condition_DI)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Division_impossible);
  if (strcmp(string, DEC_Condition_DU)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Division_undefined);
  if (strcmp(string, DEC_Condition_IE)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Inexact);
  if (strcmp(string, DEC_Condition_IS)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Insufficient_storage);
  if (strcmp(string, DEC_Condition_IC)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Invalid_context);
  if (strcmp(string, DEC_Condition_IO)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Invalid_operation);
  #if DECSUBSET
  if (strcmp(string, DEC_Condition_LD)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Lost_digits);
  #endif
  if (strcmp(string, DEC_Condition_OV)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Overflow);
  if (strcmp(string, DEC_Condition_PA)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Clamped);
  if (strcmp(string, DEC_Condition_RO)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Rounded);
  if (strcmp(string, DEC_Condition_SU)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Subnormal);
  if (strcmp(string, DEC_Condition_UN)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Underflow);
  if (strcmp(string, DEC_Condition_ZE)==0)
    return context;
  return NULL;  /* Multiple status, or unknown  */
  }